

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

int flatcc_json_parser_table_as_root
              (flatcc_builder_t *B,flatcc_json_parser_t *ctx,char *buf,size_t bufsiz,
              flatcc_json_parser_flags_t flags,char *fid,flatcc_json_parser_table_f *parser)

{
  flatcc_builder_buffer_flags_t flags_00;
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  flatcc_json_parser_t *local_98;
  flatcc_builder_ref_t local_8c;
  undefined1 local_88 [2];
  flatcc_builder_buffer_flags_t builder_flags;
  flatcc_builder_ref_t root;
  flatcc_json_parser_t _ctx;
  char *fid_local;
  flatcc_json_parser_flags_t flags_local;
  size_t bufsiz_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  flatcc_builder_t *B_local;
  
  flags_00 = 0;
  if ((flags & 4) != 0) {
    flags_00 = 2;
  }
  local_98 = ctx;
  if (ctx == (flatcc_json_parser_t *)0x0) {
    local_98 = (flatcc_json_parser_t *)local_88;
  }
  _ctx.end_loc = fid;
  flatcc_json_parser_init(local_98,B,buf,buf + bufsiz,flags);
  iVar1 = flatcc_builder_start_buffer(B,_ctx.end_loc,0,flags_00);
  if (iVar1 == 0) {
    pcVar3 = (*parser)(local_98,buf,buf + bufsiz,&local_8c);
    if (local_98->error == 0) {
      fVar2 = flatcc_builder_end_buffer(B,local_8c);
      if (fVar2 == 0) {
        B_local._4_4_ = -1;
      }
      else {
        local_98->end_loc = pcVar3;
        B_local._4_4_ = 0;
      }
    }
    else {
      B_local._4_4_ = local_98->error;
    }
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_json_parser_table_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx,
        const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid,
        flatcc_json_parser_table_f *parser)
{
    flatcc_json_parser_t _ctx;
    flatcc_builder_ref_t root;
    flatcc_builder_buffer_flags_t builder_flags = flags & flatcc_json_parser_f_with_size ? flatcc_builder_with_size : 0;

    ctx = ctx ? ctx : &_ctx;
    flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);
    if (flatcc_builder_start_buffer(B, fid, 0, builder_flags)) return -1;
    buf = parser(ctx, buf, buf + bufsiz, &root);
    if (ctx->error) {
        return ctx->error;
    }
    if (!flatcc_builder_end_buffer(B, root)) return -1;
    ctx->end_loc = buf;
    return 0;
}